

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

void __thiscall
RPCResult::RPCResult
          (RPCResult *this,Type type,string m_key_name,string description,
          vector<RPCResult,_std::allocator<RPCResult>_> inner,bool skip_type_check)

{
  long *plVar1;
  pointer pRVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  string m_key_name_00;
  string description_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  long *in_RCX;
  undefined7 in_register_00000011;
  long *plVar7;
  undefined8 *in_R8;
  byte in_R9B;
  long in_FS_OFFSET;
  undefined1 in_stack_ffffffffffffff7c [12];
  undefined1 *puVar8;
  long lVar9;
  long in_stack_ffffffffffffffb8;
  long *plVar10;
  long local_30;
  long lStack_28;
  long local_20;
  
  plVar7 = (long *)CONCAT71(in_register_00000011,skip_type_check);
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = plVar7 + 2;
  if ((long *)*plVar7 == plVar1) {
    local_30 = *plVar1;
    lStack_28 = plVar7[3];
    plVar10 = &local_30;
  }
  else {
    local_30 = *plVar1;
    plVar10 = (long *)*plVar7;
  }
  pRVar2 = (pointer)plVar7[1];
  *plVar7 = (long)plVar1;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar1 = in_RCX + 2;
  if ((long *)*in_RCX == plVar1) {
    lVar9 = *plVar1;
    in_stack_ffffffffffffffb8 = in_RCX[3];
    puVar8 = &stack0xffffffffffffffb0;
  }
  else {
    lVar9 = *plVar1;
    puVar8 = (undefined1 *)*in_RCX;
  }
  lVar3 = in_RCX[1];
  *in_RCX = (long)plVar1;
  in_RCX[1] = 0;
  *(undefined1 *)(in_RCX + 2) = 0;
  uVar5 = *in_R8;
  uVar6 = in_R8[1];
  uVar4 = in_R8[2];
  in_R8[2] = 0;
  *in_R8 = 0;
  in_R8[1] = 0;
  m_key_name_00._4_12_ = in_stack_ffffffffffffff7c;
  m_key_name_00._M_dataplus._M_p._0_4_ = (uint)in_R9B;
  m_key_name_00.field_2._M_allocated_capacity = uVar5;
  m_key_name_00.field_2._8_8_ = uVar6;
  description_00._M_string_length = (size_type)puVar8;
  description_00._M_dataplus._M_p = (pointer)uVar4;
  description_00.field_2._M_allocated_capacity = lVar3;
  description_00.field_2._8_8_ = lVar9;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)plVar10;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffffb8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = pRVar2;
  RPCResult(this,type,m_key_name_00,SUB81(&stack0xffffffffffffffc0,0),description_00,inner_00,false)
  ;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffff88);
  if (puVar8 != &stack0xffffffffffffffb0) {
    operator_delete(puVar8,lVar9 + 1);
  }
  if (plVar10 != &local_30) {
    operator_delete(plVar10,local_30 + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

RPCResult(
        Type type,
        std::string m_key_name,
        std::string description,
        std::vector<RPCResult> inner = {},
        bool skip_type_check = false)
        : RPCResult{type, std::move(m_key_name), /*optional=*/false, std::move(description), std::move(inner), skip_type_check} {}